

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::recordCommandBufferFinalize(CLIntercept *this,cl_command_buffer_khr cmdbuf)

{
  mutex *__mutex;
  int iVar1;
  mapped_type *pmVar2;
  undefined8 uVar3;
  cl_command_buffer_khr local_18;
  
  __mutex = &this->m_Mutex;
  local_18 = cmdbuf;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    pmVar2 = std::
             map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
             ::operator[](&this->m_CommandBufferRecordMap,&local_18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pmVar2,"}\n",2);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void CLIntercept::recordCommandBufferFinalize(
    cl_command_buffer_khr cmdbuf )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    SCommandBufferRecord& recording = m_CommandBufferRecordMap[ cmdbuf ];
    recording.recordFinalize();
}